

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

color_quad_u8 __thiscall
crnlib::rg_etc1::etc1_block::unpack_color4
          (etc1_block *this,uint16 packed_color4,bool scaled,uint alpha)

{
  undefined3 in_register_00000011;
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  
  bVar3 = (byte)packed_color4 & 0xf;
  bVar2 = (byte)packed_color4 >> 4;
  bVar4 = (byte)(packed_color4 >> 8) & 0xf;
  uVar1 = 0xff;
  if (alpha < 0xff) {
    uVar1 = alpha;
  }
  bVar6 = CONCAT31(in_register_00000011,scaled) == 0;
  bVar5 = bVar4 * '\x11';
  if (bVar6) {
    bVar5 = bVar4;
  }
  (this->field_0).m_bytes[0] = bVar5;
  bVar4 = bVar3 * '\x11';
  bVar5 = bVar2 * '\x11';
  if (bVar6) {
    bVar4 = bVar3;
    bVar5 = bVar2;
  }
  (this->field_0).m_bytes[1] = bVar5;
  (this->field_0).m_bytes[2] = bVar4;
  (this->field_0).m_bytes[3] = (uint8)uVar1;
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 etc1_block::unpack_color4(uint16 packed_color4, bool scaled, uint alpha)
        {
            uint b = packed_color4 & 15U;
            uint g = (packed_color4 >> 4U) & 15U;
            uint r = (packed_color4 >> 8U) & 15U;

            if (scaled)
            {
                b = (b << 4U) | b;
                g = (g << 4U) | g;
                r = (r << 4U) | r;
            }

            return color_quad_u8(cNoClamp, r, g, b, rg_etc1::minimum(alpha, 255U));
        }